

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

FilterPropagateResult
duckdb::StringStats::CheckZonemap
          (const_data_ptr_t min_data,idx_t min_len,const_data_ptr_t max_data,idx_t max_len,
          ExpressionType comparison_type,string *constant)

{
  const_data_ptr_t data;
  int iVar1;
  int iVar2;
  InternalException *this;
  FilterPropagateResult FVar3;
  ulong len;
  undefined3 in_register_00000081;
  allocator local_51;
  string local_50;
  
  data = (const_data_ptr_t)(constant->_M_dataplus)._M_p;
  len = constant->_M_string_length;
  if (len <= min_len) {
    min_len = len;
  }
  iVar1 = StringValueComparison(data,min_len,min_data);
  if (max_len < len) {
    len = max_len;
  }
  iVar2 = StringValueComparison(data,len,max_data);
  switch(CONCAT31(in_register_00000081,comparison_type)) {
  case 0x19:
  case 0x28:
    FVar3 = FILTER_ALWAYS_FALSE;
    if (-1 < iVar1) {
      FVar3 = (0 < iVar2) * '\x02';
    }
    break;
  case 0x1a:
  case 0x25:
    FVar3 = 0 < iVar2 || iVar1 < 0;
    break;
  case 0x1b:
  case 0x1d:
    FVar3 = (FilterPropagateResult)((uint)iVar1 >> 0x1e) & FILTER_ALWAYS_FALSE;
    break;
  case 0x1c:
  case 0x1e:
    FVar3 = (0 < iVar2) * '\x02';
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Expression type not implemented for string statistics zone map",
               &local_51);
    InternalException::InternalException(this,&local_50);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return FVar3;
}

Assistant:

FilterPropagateResult StringStats::CheckZonemap(const_data_ptr_t min_data, idx_t min_len, const_data_ptr_t max_data,
                                                idx_t max_len, ExpressionType comparison_type, const string &constant) {
	auto data = const_data_ptr_cast(constant.c_str());
	idx_t size = constant.size();

	int min_comp = StringValueComparison(data, MinValue(min_len, size), min_data);
	int max_comp = StringValueComparison(data, MinValue(max_len, size), max_data);
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (min_comp >= 0 && max_comp <= 0) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (min_comp < 0 || max_comp > 0) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHAN:
		if (max_comp <= 0) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		if (min_comp >= 0) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type not implemented for string statistics zone map");
	}
}